

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O0

Padding * absl::lts_20250127::str_format_internal::anon_unknown_0::ExtraWidthToPadding
                    (Padding *__return_storage_ptr__,size_t total_size,FormatState *state)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  size_t missing_chars;
  FormatState *state_local;
  size_t total_size_local;
  
  iVar2 = FormatConversionSpecImpl::width(state->conv);
  if ((iVar2 < 0) ||
     (iVar2 = FormatConversionSpecImpl::width(state->conv), (ulong)(long)iVar2 <= total_size)) {
    memset(__return_storage_ptr__,0,0x18);
    return __return_storage_ptr__;
  }
  iVar2 = FormatConversionSpecImpl::width(state->conv);
  sVar3 = (long)iVar2 - total_size;
  bVar1 = FormatConversionSpecImpl::has_left_flag(state->conv);
  if (bVar1) {
    __return_storage_ptr__->left_spaces = 0;
    __return_storage_ptr__->zeros = 0;
    __return_storage_ptr__->right_spaces = sVar3;
    return __return_storage_ptr__;
  }
  bVar1 = FormatConversionSpecImpl::has_zero_flag(state->conv);
  if (!bVar1) {
    __return_storage_ptr__->left_spaces = sVar3;
    __return_storage_ptr__->zeros = 0;
    __return_storage_ptr__->right_spaces = 0;
    return __return_storage_ptr__;
  }
  __return_storage_ptr__->left_spaces = 0;
  __return_storage_ptr__->zeros = sVar3;
  __return_storage_ptr__->right_spaces = 0;
  return __return_storage_ptr__;
}

Assistant:

Padding ExtraWidthToPadding(size_t total_size, const FormatState &state) {
  if (state.conv.width() < 0 ||
      static_cast<size_t>(state.conv.width()) <= total_size) {
    return {0, 0, 0};
  }
  size_t missing_chars = static_cast<size_t>(state.conv.width()) - total_size;
  if (state.conv.has_left_flag()) {
    return {0, 0, missing_chars};
  } else if (state.conv.has_zero_flag()) {
    return {0, missing_chars, 0};
  } else {
    return {missing_chars, 0, 0};
  }
}